

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O0

SimpleString __thiscall
JUnitTestOutput::encodeFileName(JUnitTestOutput *this,SimpleString *fileName)

{
  SimpleString *in_RDX;
  size_t extraout_RDX;
  size_t sVar1;
  size_t extraout_RDX_00;
  SimpleString SVar2;
  char *local_30;
  char *sym;
  SimpleString *fileName_local;
  JUnitTestOutput *this_local;
  SimpleString *result;
  
  SimpleString::SimpleString((SimpleString *)this,in_RDX);
  sVar1 = extraout_RDX;
  for (local_30 = "/\\?%*:|\"<>"; *local_30 != '\0'; local_30 = local_30 + 1) {
    SimpleString::replace((SimpleString *)this,*local_30,'_');
    sVar1 = extraout_RDX_00;
  }
  SVar2.bufferSize_ = sVar1;
  SVar2.buffer_ = (char *)this;
  return SVar2;
}

Assistant:

SimpleString JUnitTestOutput::encodeFileName(const SimpleString& fileName)
{
    // special character list based on: https://en.wikipedia.org/wiki/Filename
    static const char* const forbiddenCharacters = "/\\?%*:|\"<>";

    SimpleString result = fileName;
    for (const char* sym = forbiddenCharacters; *sym; ++sym) {
        result.replace(*sym, '_');
    }
    return result;
}